

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

bool __thiscall cfd::core::ByteData160::operator==(ByteData160 *this,ByteData160 *object)

{
  bool bVar1;
  ByteData160 *object_local;
  ByteData160 *this_local;
  
  bVar1 = ::std::operator==(&this->data_,&object->data_);
  return bVar1;
}

Assistant:

bool ByteData160::operator==(const ByteData160& object) const {
  return (data_ == object.data_);
}